

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O0

FloatParts return_nan(FloatParts a,float_status *s)

{
  undefined4 uVar1;
  FloatParts FVar2;
  float_status *local_40;
  float_status *s_local;
  FloatParts a_local;
  undefined8 local_10;
  
  s_local = (float_status *)a.frac;
  a_local.frac._0_4_ = a.exp;
  a_local.frac._4_4_ = a._12_4_;
  uVar1 = a_local.frac._4_4_;
  a_local.frac._4_1_ = a.cls;
  if (a_local.frac._4_1_ != float_class_qnan) {
    if (a_local.frac._4_1_ != float_class_snan) {
      g_assertion_message_expr
                ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/fpu/softfloat.c"
                 ,0x38e,(char *)0x0);
    }
    s->float_exception_flags = s->float_exception_flags | 1;
    FVar2 = parts_silence_nan(a,s);
    local_40 = (float_status *)FVar2.frac;
    s_local = local_40;
    a_local.frac._0_4_ = FVar2.exp;
    a_local.frac._4_4_ = FVar2._12_4_;
    uVar1 = a_local.frac._4_4_;
  }
  a_local.frac._4_4_ = uVar1;
  if (s->default_nan_mode == '\0') {
    local_10._4_1_ = a_local.frac._4_1_;
    local_10._5_1_ = (_Bool)a_local.frac._5_1_;
    local_10._6_2_ = a_local.frac._6_2_;
    local_10._0_4_ = (int32_t)a_local.frac;
    a_local._8_8_ = s_local;
  }
  else {
    join_0x00000010_0x00000000_ = parts_default_nan(s);
  }
  return stack0xffffffffffffffe8;
}

Assistant:

static FloatParts return_nan(FloatParts a, float_status *s)
{
    switch (a.cls) {
    case float_class_snan:
        s->float_exception_flags |= float_flag_invalid;
        a = parts_silence_nan(a, s);
        /* fall through */
    case float_class_qnan:
        if (s->default_nan_mode) {
            return parts_default_nan(s);
        }
        break;

    default:
        g_assert_not_reached();
        break;
    }
    return a;
}